

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

string * __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::mutable_stringvalue_abi_cxx11_
          (CustomLayerParams_CustomLayerParamValue *this)

{
  bool bVar1;
  string *psVar2;
  CustomLayerParams_CustomLayerParamValue *this_local;
  
  bVar1 = has_stringvalue(this);
  if (!bVar1) {
    clear_value(this);
    set_has_stringvalue(this);
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
              (&(this->value_).stringvalue_,psVar2);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  psVar2 = google::protobuf::internal::ArenaStringPtr::MutableNoArena
                     (&(this->value_).stringvalue_,psVar2);
  return psVar2;
}

Assistant:

inline ::std::string* CustomLayerParams_CustomLayerParamValue::mutable_stringvalue() {
  if (!has_stringvalue()) {
    clear_value();
    set_has_stringvalue();
    value_.stringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CustomLayerParams.CustomLayerParamValue.stringValue)
  return value_.stringvalue_.MutableNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}